

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O2

void av1_loop_restoration_alloc
               (AV1LrSync *lr_sync,AV1_COMMON *cm,int num_workers,int num_rows_lr,int num_planes,
               int width)

{
  char *pcVar1;
  RestorationLineBuffers *pRVar2;
  ulong uVar3;
  pthread_mutex_t *ppVar4;
  pthread_cond_t *ppVar5;
  LRWorkerData *pLVar6;
  void *pvVar7;
  int *piVar8;
  AV1LrMTInfo *pAVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int j;
  
  lr_sync->rows = num_rows_lr;
  lr_sync->num_planes = num_planes;
  lVar10 = (long)num_rows_lr;
  uVar3 = 0;
  if (0 < num_rows_lr) {
    uVar3 = (ulong)(uint)num_rows_lr;
  }
  uVar11 = 0;
  if (0 < num_planes) {
    uVar11 = (ulong)(uint)num_planes;
  }
  for (uVar12 = 0; uVar12 != uVar11; uVar12 = uVar12 + 1) {
    ppVar4 = (pthread_mutex_t *)aom_malloc(lVar10 * 0x28);
    lr_sync->mutex_[uVar12] = ppVar4;
    if (ppVar4 == (pthread_mutex_t *)0x0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate lr_sync->mutex_[j]");
      if (lr_sync->mutex_[uVar12] != (pthread_mutex_t *)0x0) goto LAB_00339781;
    }
    else {
LAB_00339781:
      for (lVar13 = 0; uVar3 * 0x28 - lVar13 != 0; lVar13 = lVar13 + 0x28) {
        pthread_mutex_init((pthread_mutex_t *)((long)lr_sync->mutex_[uVar12] + lVar13),
                           (pthread_mutexattr_t *)0x0);
      }
    }
    ppVar5 = (pthread_cond_t *)aom_malloc(lVar10 * 0x30);
    lr_sync->cond_[uVar12] = ppVar5;
    if (ppVar5 == (pthread_cond_t *)0x0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate lr_sync->cond_[j]");
      if (lr_sync->cond_[uVar12] != (pthread_cond_t *)0x0) goto LAB_003397d1;
    }
    else {
LAB_003397d1:
      for (lVar13 = 0; uVar3 * 0x30 - lVar13 != 0; lVar13 = lVar13 + 0x30) {
        pthread_cond_init((pthread_cond_t *)((long)lr_sync->cond_[uVar12] + lVar13),
                          (pthread_condattr_t *)0x0);
      }
    }
  }
  ppVar4 = (pthread_mutex_t *)aom_malloc(0x28);
  lr_sync->job_mutex = ppVar4;
  if (ppVar4 == (pthread_mutex_t *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate lr_sync->job_mutex");
    ppVar4 = lr_sync->job_mutex;
    if (ppVar4 == (pthread_mutex_t *)0x0) goto LAB_00339834;
  }
  pthread_mutex_init((pthread_mutex_t *)ppVar4,(pthread_mutexattr_t *)0x0);
LAB_00339834:
  pLVar6 = (LRWorkerData *)aom_calloc((long)num_workers,0x1c0);
  lr_sync->lrworkerdata = pLVar6;
  if (pLVar6 == (LRWorkerData *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate lr_sync->lrworkerdata");
  }
  lr_sync->num_workers = num_workers;
  uVar3 = (ulong)(uint)num_workers;
  if (num_workers < 1) {
    uVar3 = 0;
  }
  lVar13 = 0;
  for (uVar12 = 0; uVar3 != uVar12; uVar12 = uVar12 + 1) {
    if ((long)uVar12 < (long)(num_workers + -1)) {
      pvVar7 = aom_memalign(0x10,0x13b9a0);
      *(void **)((lr_sync->lrworkerdata->error_info).detail + lVar13 + -0x28) = pvVar7;
      if (pvVar7 == (void *)0x0) {
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate lr_sync->lrworkerdata[worker_idx].rst_tmpbuf");
      }
      pvVar7 = aom_malloc(0x1260);
      *(void **)((lr_sync->lrworkerdata->error_info).detail + lVar13 + -0x20) = pvVar7;
      if (pvVar7 == (void *)0x0) {
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate lr_sync->lrworkerdata[worker_idx].rlbs");
      }
    }
    else {
      pRVar2 = cm->rlbs;
      pcVar1 = (lr_sync->lrworkerdata->error_info).detail + lVar13 + -0x28;
      *(int32_t **)pcVar1 = cm->rst_tmpbuf;
      *(RestorationLineBuffers **)(pcVar1 + 8) = pRVar2;
    }
    lVar13 = lVar13 + 0x1c0;
  }
  for (uVar3 = 0; uVar11 != uVar3; uVar3 = uVar3 + 1) {
    piVar8 = (int *)aom_malloc(lVar10 * 4);
    lr_sync->cur_sb_col[uVar3] = piVar8;
    if (piVar8 == (int *)0x0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate lr_sync->cur_sb_col[j]");
    }
  }
  pAVar9 = (AV1LrMTInfo *)aom_malloc(lVar10 * num_planes * 0x1c);
  lr_sync->job_queue = pAVar9;
  if (pAVar9 == (AV1LrMTInfo *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate lr_sync->job_queue");
  }
  lr_sync->sync_range = 1;
  return;
}

Assistant:

void av1_loop_restoration_alloc(AV1LrSync *lr_sync, AV1_COMMON *cm,
                                int num_workers, int num_rows_lr,
                                int num_planes, int width) {
  lr_sync->rows = num_rows_lr;
  lr_sync->num_planes = num_planes;
#if CONFIG_MULTITHREAD
  {
    int i, j;

    for (j = 0; j < num_planes; j++) {
      CHECK_MEM_ERROR(cm, lr_sync->mutex_[j],
                      aom_malloc(sizeof(*(lr_sync->mutex_[j])) * num_rows_lr));
      if (lr_sync->mutex_[j]) {
        for (i = 0; i < num_rows_lr; ++i) {
          pthread_mutex_init(&lr_sync->mutex_[j][i], NULL);
        }
      }

      CHECK_MEM_ERROR(cm, lr_sync->cond_[j],
                      aom_malloc(sizeof(*(lr_sync->cond_[j])) * num_rows_lr));
      if (lr_sync->cond_[j]) {
        for (i = 0; i < num_rows_lr; ++i) {
          pthread_cond_init(&lr_sync->cond_[j][i], NULL);
        }
      }
    }

    CHECK_MEM_ERROR(cm, lr_sync->job_mutex,
                    aom_malloc(sizeof(*(lr_sync->job_mutex))));
    if (lr_sync->job_mutex) {
      pthread_mutex_init(lr_sync->job_mutex, NULL);
    }
  }
#endif  // CONFIG_MULTITHREAD
  CHECK_MEM_ERROR(cm, lr_sync->lrworkerdata,
                  aom_calloc(num_workers, sizeof(*(lr_sync->lrworkerdata))));
  lr_sync->num_workers = num_workers;

  for (int worker_idx = 0; worker_idx < num_workers; ++worker_idx) {
    if (worker_idx < num_workers - 1) {
      CHECK_MEM_ERROR(cm, lr_sync->lrworkerdata[worker_idx].rst_tmpbuf,
                      (int32_t *)aom_memalign(16, RESTORATION_TMPBUF_SIZE));
      CHECK_MEM_ERROR(cm, lr_sync->lrworkerdata[worker_idx].rlbs,
                      aom_malloc(sizeof(RestorationLineBuffers)));

    } else {
      lr_sync->lrworkerdata[worker_idx].rst_tmpbuf = cm->rst_tmpbuf;
      lr_sync->lrworkerdata[worker_idx].rlbs = cm->rlbs;
    }
  }

  for (int j = 0; j < num_planes; j++) {
    CHECK_MEM_ERROR(
        cm, lr_sync->cur_sb_col[j],
        aom_malloc(sizeof(*(lr_sync->cur_sb_col[j])) * num_rows_lr));
  }
  CHECK_MEM_ERROR(
      cm, lr_sync->job_queue,
      aom_malloc(sizeof(*(lr_sync->job_queue)) * num_rows_lr * num_planes));
  // Set up nsync.
  lr_sync->sync_range = get_lr_sync_range(width);
}